

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O0

void __thiscall Listener::Listener(Listener *this)

{
  Listener *this_local;
  
  acto::actor::actor(&this->super_actor);
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__Listener_0012a920;
  (this->super_actor).field_0x51 = 0;
  this->m_counter = 0;
  acto::actor::handler<msg_loop,Listener,msg_loop_const&>(&this->super_actor,0x107640);
  acto::actor::handler<msg_start,Listener,msg_start_const&>(&this->super_actor,0x107790);
  acto::actor::handler<msg_stop,Listener,msg_stop_const&>(&this->super_actor,0x1078d0);
  return;
}

Assistant:

Listener()
    : m_active(false)
    , m_counter(0)
  {
    handler< msg_loop  >(&Listener::doLoop);
    handler< msg_start >(&Listener::doStart);
    handler< msg_stop  >(&Listener::doStop);
  }